

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O2

bool __thiscall
S2MaxDistanceShapeIndexTarget::UpdateMinDistance
          (S2MaxDistanceShapeIndexTarget *this,S2Cell *cell,S2MaxDistance *min_dist)

{
  S2FurthestEdgeQuery *this_00;
  Result RVar1;
  Target local_48;
  undefined **local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  VType local_28;
  VType VStack_20;
  VType local_18;
  VType VStack_10;
  
  this_00 = (this->query_)._M_t.
            super___uniq_ptr_impl<S2FurthestEdgeQuery,_std::default_delete<S2FurthestEdgeQuery>_>.
            _M_t.
            super__Tuple_impl<0UL,_S2FurthestEdgeQuery_*,_std::default_delete<S2FurthestEdgeQuery>_>
            .super__Head_base<0UL,_S2FurthestEdgeQuery_*,_false>._M_head_impl;
  *(double *)&(this_00->options_).super_Options = (min_dist->distance_).length2_;
  local_40 = &PTR__S2Region_003047c0;
  local_38 = *(undefined8 *)&cell->face_;
  uStack_30 = *(undefined8 *)((long)&(cell->id_).id_ + 5);
  local_28 = (cell->uv_).bounds_[0].bounds_.c_[0];
  VStack_20 = (cell->uv_).bounds_[0].bounds_.c_[1];
  local_18 = (cell->uv_).bounds_[1].bounds_.c_[0];
  VStack_10 = (cell->uv_).bounds_[1].bounds_.c_[1];
  local_48._vptr_S2DistanceTarget = (_func_int **)&PTR__S2MaxDistanceCellTarget_00304f90;
  RVar1 = S2FurthestEdgeQuery::FindFurthestEdge(this_00,&local_48);
  if (-1 < RVar1.shape_id_) {
    (min_dist->distance_).length2_ = RVar1.distance_.length2_.length2_;
  }
  return -1 < RVar1.shape_id_;
}

Assistant:

bool S2MaxDistanceShapeIndexTarget::UpdateMinDistance(
    const S2Cell& cell, S2MaxDistance* min_dist) {
  query_->mutable_options()->set_min_distance(S1ChordAngle(*min_dist));
  S2FurthestEdgeQuery::CellTarget target(cell);
  S2FurthestEdgeQuery::Result r = query_->FindFurthestEdge(&target);
  if (r.shape_id() < 0) return false;
  *min_dist = S2MaxDistance(r.distance());
  return true;
}